

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string sentence;
  string local_30 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Enter a sentence terminated by dot and press enter. ");
  std::operator<<(poVar1,"\nThere must be a space character after last word in sentence and dot.\n")
  ;
  readSentence_abi_cxx11_();
  poVar1 = std::operator<<((ostream *)&std::cout,"OK");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
	std::cout << "Enter a sentence terminated by dot and press enter. "
			  << "\nThere must be a space character after last word in sentence and dot.\n";

	try
	{
		auto sentence = readSentence();
		std::cout << "OK" << std::endl;
	}
	catch (std::runtime_error& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}